

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall Socket_ConnectIPV6_Test::~Socket_ConnectIPV6_Test(Socket_ConnectIPV6_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Socket, ConnectIPV6) {
    constexpr uint16_t PORT = 27000;

    ServerSocket server(AddressFamily::IPV6);
    server.bind("::1", PORT);

    std::thread thread([&]() {
        try {
            server.accept();
        } catch (const std::exception &ex) {
            FAIL() << ex.what() << '\n';
        }
    });

    Socket socket(AddressFamily::IPV6);
    socket.setSoLinger(false, 0);
    socket.connect("::1", PORT);
    thread.join();
}